

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void YUY2ToUVRow_AVX2(uint8_t *src_yuy2,int stride_yuy2,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 in_ZMM5 [64];
  
  auVar6 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar6 = vpsrlw_avx2(auVar6,8);
  lVar2 = (long)dst_v - (long)dst_u;
  do {
    auVar4 = vpavgb_avx2(*(undefined1 (*) [32])src_yuy2,
                         *(undefined1 (*) [32])(*(undefined1 (*) [32])src_yuy2 + stride_yuy2));
    auVar5 = vpavgb_avx2(*(undefined1 (*) [32])((long)src_yuy2 + 0x20),
                         *(undefined1 (*) [32])
                          (*(undefined1 (*) [32])((long)src_yuy2 + 0x20) + stride_yuy2));
    src_yuy2 = (uint8_t *)((long)src_yuy2 + 0x40);
    auVar4 = vpsrlw_avx2(auVar4,8);
    auVar5 = vpsrlw_avx2(auVar5,8);
    auVar4 = vpackuswb_avx2(auVar4,auVar5);
    auVar5 = vpermq_avx2(auVar4,0xd8);
    auVar4 = vpand_avx2(auVar5,auVar6);
    auVar5 = vpsrlw_avx2(auVar5,8);
    auVar4 = vpackuswb_avx2(auVar4,auVar4);
    auVar5 = vpackuswb_avx2(auVar5,auVar5);
    auVar4 = vpermq_avx2(auVar4,0xd8);
    auVar5 = vpermq_avx2(auVar5,0xd8);
    *(undefined1 (*) [16])dst_u = auVar4._0_16_;
    *(undefined1 (*) [16])((long)dst_u + lVar2) = auVar5._0_16_;
    dst_u = (uint8_t *)((long)dst_u + 0x10);
    iVar3 = width + -0x20;
    bVar1 = 0x1f < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar1);
  return;
}

Assistant:

void YUY2ToUVRow_AVX2(const uint8_t* src_yuy2,
                      int stride_yuy2,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  asm volatile(
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"
      "vpsrlw      $0x8,%%ymm5,%%ymm5            \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "vpavgb      0x00(%0,%4,1),%%ymm0,%%ymm0   \n"
      "vpavgb      0x20(%0,%4,1),%%ymm1,%%ymm1   \n"
      "lea         0x40(%0),%0                   \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpsrlw      $0x8,%%ymm1,%%ymm1            \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vpand       %%ymm5,%%ymm0,%%ymm1          \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpackuswb   %%ymm1,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm0,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm1,%%ymm1           \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vextractf128 $0x0,%%ymm1,(%1)             \n"
      "vextractf128 $0x0,%%ymm0,0x00(%1,%2,1)    \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x20,%3                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_yuy2),               // %0
        "+r"(dst_u),                  // %1
        "+r"(dst_v),                  // %2
        "+r"(width)                   // %3
      : "r"((intptr_t)(stride_yuy2))  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}